

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O0

base_learner * mf_setup(options_i *options,vw *all)

{
  byte bVar1;
  typed_option<unsigned_long> *this;
  pointer pmVar2;
  base_learner *base;
  learner<mf,_example> *base_00;
  id in_RSI;
  long *in_RDI;
  learner<mf,_example> *l;
  option_group_definition new_options;
  free_ptr<mf> data;
  typed_option<unsigned_long> *in_stack_fffffffffffffd28;
  vw *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  single_learner *in_stack_fffffffffffffd40;
  id this_00;
  typed_option<unsigned_long> *in_stack_fffffffffffffd78;
  allocator *paVar3;
  allocator local_249;
  string local_248 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdd0;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_long> local_1d8;
  learner<char,_char> *in_stack_fffffffffffffef0;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  undefined1 local_28 [32];
  AllReduce *local_8;
  
  local_28._16_8_ = in_RSI._M_thread;
  local_28._24_8_ = in_RDI;
  scoped_calloc_or_throw<mf>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Matrix Factorization Reduction",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd30,
             (string *)in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"new_mf",&local_1f9);
  std::unique_ptr<mf,_void_(*)(void_*)>::operator->((unique_ptr<mf,_void_(*)(void_*)> *)0x23b59c);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffd38,(unsigned_long *)in_stack_fffffffffffffd30);
  VW::config::typed_option<unsigned_long>::keep(&local_1d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"rank for reduction-based matrix factorization",&local_221)
  ;
  this = VW::config::typed_option<unsigned_long>::help
                   ((typed_option<unsigned_long> *)in_stack_fffffffffffffd30,
                    (string *)in_stack_fffffffffffffd28);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  VW::config::option_group_definition::add<unsigned_long>
            ((option_group_definition *)this,in_stack_fffffffffffffd78);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_60);
  paVar3 = &local_249;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"new_mf",paVar3);
  bVar1 = (**(code **)(*(long *)local_28._24_8_ + 8))(local_28._24_8_,local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    this_00._M_thread = local_28._16_8_;
    pmVar2 = std::unique_ptr<mf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<mf,_void_(*)(void_*)> *)0x23b8f4);
    pmVar2->all = (vw *)this_00._M_thread;
    std::unique_ptr<mf,_void_(*)(void_*)>::operator->((unique_ptr<mf,_void_(*)(void_*)> *)0x23b91d);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x23b940);
    *(bool *)(local_28._16_8_ + 0x3451) = true;
    base = setup_base((options_i *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    in_stack_fffffffffffffd40 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffef0);
    in_stack_fffffffffffffd30 = (vw *)local_28;
    std::unique_ptr<mf,_void_(*)(void_*)>::operator->((unique_ptr<mf,_void_(*)(void_*)> *)0x23b98e);
    base_00 = LEARNER::init_learner<mf,example,LEARNER::learner<char,example>>
                        ((free_ptr<mf> *)this_00._M_thread,(learner<char,_example> *)base,
                         (_func_void_mf_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffd40,
                         (_func_void_mf_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
    LEARNER::learner<mf,_example>::set_finish
              ((learner<mf,_example> *)this_00._M_thread,(_func_void_mf_ptr *)base);
    local_8 = (AllReduce *)LEARNER::make_base<mf,example>(base_00);
  }
  else {
    local_8 = (AllReduce *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd30);
  std::unique_ptr<mf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<mf,_void_(*)(void_*)> *)in_stack_fffffffffffffd40);
  return (base_learner *)local_8;
}

Assistant:

base_learner* mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<mf>();
  option_group_definition new_options("Matrix Factorization Reduction");
  new_options.add(make_option("new_mf", data->rank).keep().help("rank for reduction-based matrix factorization"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("new_mf"))
    return nullptr;

  data->all = &all;
  // store global pairs in local data structure and clear global pairs
  // for eventual calls to base learner
  data->pairs = all.pairs;
  all.pairs.clear();

  all.random_positive_weights = true;

  learner<mf, example>& l =
      init_learner(data, as_singleline(setup_base(options, all)), learn, predict<false>, 2 * data->rank + 1);
  l.set_finish(finish);
  return make_base(l);
}